

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

string * __thiscall
polyscope::renderDataTypeName_abi_cxx11_
          (string *__return_storage_ptr__,polyscope *this,RenderDataType *r)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 0:
    pcVar3 = "Vector2Float";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "Vector3Float";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "Vector4Float";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "Matrix44Float";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "Float";
    pcVar2 = "";
    break;
  case 5:
    pcVar3 = "Int";
    pcVar2 = "";
    break;
  case 6:
    pcVar3 = "UInt";
    pcVar2 = "";
    break;
  case 7:
    pcVar3 = "Vector2UInt";
    pcVar2 = "";
    break;
  case 8:
    pcVar3 = "Vector3UInt";
    pcVar2 = "";
    break;
  case 9:
    pcVar3 = "Vector4UInt";
    pcVar2 = "";
    break;
  default:
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string renderDataTypeName(const RenderDataType& r) {
  switch (r) {
  case RenderDataType::Vector2Float:
    return "Vector2Float";
  case RenderDataType::Vector3Float:
    return "Vector3Float";
  case RenderDataType::Vector4Float:
    return "Vector4Float";
  case RenderDataType::Matrix44Float:
    return "Matrix44Float";
  case RenderDataType::Float:
    return "Float";
  case RenderDataType::Int:
    return "Int";
  case RenderDataType::UInt:
    return "UInt";
  case RenderDataType::Vector2UInt:
    return "Vector2UInt";
  case RenderDataType::Vector3UInt:
    return "Vector3UInt";
  case RenderDataType::Vector4UInt:
    return "Vector4UInt";
  }
  return "";
}